

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::JSONInputArchive,_0U>::InputArchive
          (InputArchive<cereal::JSONInputArchive,_0U> *this,JSONInputArchive *derived)

{
  JSONInputArchive *derived_local;
  InputArchive<cereal::JSONInputArchive,_0U> *this_local;
  
  detail::InputArchiveBase::InputArchiveBase(&this->super_InputArchiveBase);
  (this->super_InputArchiveBase)._vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_00437028;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&this->itsDeferments);
  this->self = derived;
  memset(&this->itsBaseClassSet,0,0x38);
  std::
  unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
  ::unordered_set(&this->itsBaseClassSet);
  memset(&this->itsSharedPointerMap,0,0x38);
  std::
  unordered_map<unsigned_int,_std::shared_ptr<void>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>_>
  ::unordered_map(&this->itsSharedPointerMap);
  memset(&this->itsPolymorphicTypeMap,0,0x38);
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->itsPolymorphicTypeMap);
  memset(&this->itsVersionedTypes,0,0x38);
  std::
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::unordered_map(&this->itsVersionedTypes);
  return;
}

Assistant:

InputArchive(ArchiveType * const derived) :
        self(derived),
        itsBaseClassSet(),
        itsSharedPointerMap(),
        itsPolymorphicTypeMap(),
        itsVersionedTypes()
      { }